

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::
     TraverseShaderRec<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
               (string *path_prefix,Prim *prim,uint32_t depth,
               PathShaderMap<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> *itemmap)

{
  size_type *psVar1;
  pointer pcVar2;
  Prim *pPVar3;
  bool bVar4;
  undefined8 *puVar5;
  Shader *pSVar6;
  UsdPrimvarReader<std::array<float,_4UL>_> *pUVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  undefined8 uVar10;
  Prim *prim_00;
  bool bVar11;
  string prim_abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  key_type local_90;
  string local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  if (0x20000 < depth) {
    return false;
  }
  pcVar2 = (path_prefix->_M_dataplus)._M_p;
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + path_prefix->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_50);
  Path::full_path_name_abi_cxx11_(&local_70,&prim->_path);
  uVar9 = 0xf;
  if (local_50 != local_40) {
    uVar9 = local_40[0];
  }
  if (uVar9 < local_70._M_string_length + local_48) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar10 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_48 <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_0034396f;
    }
  }
  puVar5 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
LAB_0034396f:
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_90.field_2._M_allocated_capacity = *psVar1;
    local_90.field_2._8_8_ = puVar5[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar1;
    local_90._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_90._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pSVar6 = tinyusdz::value::Value::as<tinyusdz::Shader>(&prim->_data,false);
  if ((pSVar6 != (Shader *)0x0) &&
     (pUVar7 = tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                         (&pSVar6->value,false),
     pUVar7 != (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0)) {
    pmVar8 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_tinyusdz::Shader_*,_const_tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_tinyusdz::Shader_*,_const_tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_*>_>_>_>
             ::operator[](itemmap,&local_90);
    pmVar8->first = pSVar6;
    pmVar8->second = pUVar7;
  }
  prim_00 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar11 = prim_00 == pPVar3;
  if (!bVar11) {
    bVar4 = TraverseShaderRec<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                      (&local_90,prim_00,depth + 1,itemmap);
    if (bVar4) {
      do {
        prim_00 = prim_00 + 1;
        bVar11 = prim_00 == pPVar3;
        if (bVar11) break;
        bVar4 = TraverseShaderRec<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                          (&local_90,prim_00,depth + 1,itemmap);
      } while (bVar4);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return bVar11;
}

Assistant:

bool TraverseShaderRec(const std::string &path_prefix,
                       const tinyusdz::Prim &prim, uint32_t depth,
                       PathShaderMap<ShaderTy> &itemmap) {
  if (depth > 1024 * 128) {
    // Too deep
    return false;
  }

  std::string prim_abs_path =
      path_prefix + "/" + prim.local_path().full_path_name();

  // First check if type is Shader Prim.
  if (const Shader *ps = prim.as<Shader>()) {
    // Then check if wanted Shder type
    if (const ShaderTy *s = ps->value.as<ShaderTy>()) {
      itemmap[prim_abs_path] = std::make_pair(ps, s);
    }
  }

  for (const auto &child : prim.children()) {
    if (!TraverseShaderRec(prim_abs_path, child, depth + 1, itemmap)) {
      return false;
    }
  }

  return true;
}